

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::~Restaurant(Restaurant *this)

{
  bool bVar1;
  reference ppTVar2;
  reference ppBVar3;
  BaseAction **j;
  iterator __end1_1;
  iterator __begin1_1;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *__range1_1;
  Table **table;
  iterator __end1;
  iterator __begin1;
  vector<Table_*,_std::allocator<Table_*>_> *__range1;
  Restaurant *this_local;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_00120d80;
  __end1 = std::vector<Table_*,_std::allocator<Table_*>_>::begin(&this->tables);
  table = (Table **)std::vector<Table_*,_std::allocator<Table_*>_>::end(&this->tables);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Table_**,_std::vector<Table_*,_std::allocator<Table_*>_>_>
                                *)&table);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<Table_**,_std::vector<Table_*,_std::allocator<Table_*>_>_>::
              operator*(&__end1);
    if (*ppTVar2 != (Table *)0x0) {
      (*(*ppTVar2)->_vptr_Table[1])();
    }
    __gnu_cxx::__normal_iterator<Table_**,_std::vector<Table_*,_std::allocator<Table_*>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::begin(&this->actionsLog);
  j = (BaseAction **)
      std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::end(&this->actionsLog);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<BaseAction_**,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
                        *)&j);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<BaseAction_**,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
              ::operator*(&__end1_1);
    if (*ppBVar3 != (BaseAction *)0x0) {
      (*(*ppBVar3)->_vptr_BaseAction[4])();
    }
    __gnu_cxx::
    __normal_iterator<BaseAction_**,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>::
    operator++(&__end1_1);
  }
  std::vector<Table_*,_std::allocator<Table_*>_>::clear(&this->tables);
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::clear(&this->actionsLog);
  std::vector<Dish,_std::allocator<Dish>_>::clear(&this->menu);
  std::__cxx11::string::~string((string *)&this->newMsg);
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::~vector(&this->actionsLog);
  std::vector<Dish,_std::allocator<Dish>_>::~vector(&this->menu);
  std::vector<Table_*,_std::allocator<Table_*>_>::~vector(&this->tables);
  return;
}

Assistant:

Restaurant::~Restaurant()
{
    for (auto &table : tables) {
        delete table;
    }
    for (auto &j : actionsLog) {
        delete j;
    }
    tables.clear();
    actionsLog.clear();
    menu.clear();
}